

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest_add_hl_de_carry_Test::CpuTest_add_hl_de_carry_Test
          (CpuTest_add_hl_de_carry_Test *this)

{
  CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test = (_func_int **)&PTR__CpuTest_00193308;
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_de_carry) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 0xFF;
    regs.d = 0x10;
    execute_instruction(0x19);

    ICpu::Registers expected_regs{};
    expected_regs.h = 0x0F;
    expected_regs.d = 0x10;
    expected_regs.f = ICpu::Z_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}